

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::eval::Inline_Array_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_>::eval_internal
          (Inline_Array_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_> *this,Dispatch_State *t_ss
          )

{
  Type_Conversions *pTVar1;
  long lVar2;
  undefined8 *puVar3;
  Dispatch_State *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 *puVar4;
  Boxed_Value BVar5;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> vec;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> local_78;
  detail local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  undefined1 local_40 [16];
  
  local_78.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pTVar1 = t_ss[2].m_conversions.m_conversions._M_data;
  if (pTVar1 != (Type_Conversions *)t_ss[2].m_conversions.m_saves._M_data) {
    lVar2 = (pTVar1->m_mutex)._M_impl._M_rwlock.__align;
    Catch::clara::std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::
    reserve(&local_78,*(long *)(lVar2 + 0x58) - *(long *)(lVar2 + 0x50) >> 3);
    lVar2 = ((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl._M_rwlock.__align;
    puVar3 = *(undefined8 **)(lVar2 + 0x58);
    for (puVar4 = *(undefined8 **)(lVar2 + 0x50); puVar4 != puVar3; puVar4 = puVar4 + 1) {
      AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>::eval
                ((AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_> *)local_40,
                 (Dispatch_State *)*puVar4);
      detail::clone_if_necessary
                (local_50,(Boxed_Value *)local_40,(atomic_uint_fast32_t *)&t_ss[3].m_stack_holder,
                 in_RDX);
      Catch::clara::std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::
      emplace_back<chaiscript::Boxed_Value>(&local_78,(Boxed_Value *)local_50);
      Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
      Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
    }
  }
  chaiscript::detail::
  const_var_impl<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
            ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)this);
  Catch::clara::std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::
  ~vector(&local_78);
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const override {
        try {
          std::vector<Boxed_Value> vec;
          if (!this->children.empty()) {
            vec.reserve(this->children[0]->children.size());
            for (const auto &child : this->children[0]->children) {
              vec.push_back(detail::clone_if_necessary(child->eval(t_ss), m_loc, t_ss));
            }
          }
          return const_var(std::move(vec));
        } catch (const exception::dispatch_error &) {
          throw exception::eval_error("Can not find appropriate 'clone' or copy constructor for vector elements");
        }
      }